

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O2

void __thiscall
vkt::sr::QuadGrid::QuadGrid
          (QuadGrid *this,int gridSize,int width,int height,Vec4 *constCoords,
          vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
          *userAttribTransforms,
          vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
          *textures)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this_00;
  pointer pVVar1;
  pointer puVar2;
  int iVar3;
  unsigned_short uVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *pvVar13;
  int attribNdx;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  unsigned_short uVar19;
  int x;
  ulong uVar20;
  float fx;
  float fVar21;
  float fVar22;
  float fy;
  Vector<float,_4> local_c8;
  float local_b8;
  float fStack_b4;
  undefined4 uStack_b0;
  float fStack_ac;
  undefined1 local_a8 [36];
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  float fStack_5c;
  float local_58;
  pointer local_40;
  pointer pVStack_38;
  
  this->m_gridSize = gridSize;
  uVar7 = gridSize + 1;
  this->m_numVertices = uVar7 * uVar7;
  this->m_numTriangles = gridSize * gridSize * 2;
  tcu::Vector<float,_4>::Vector(&this->m_constCoords,constCoords);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::vector
            (&this->m_userAttribTransforms,userAttribTransforms);
  this->m_textures = textures;
  this_00 = &this->m_screenPos;
  memset(this_00,0,0xf0);
  local_40 = (pointer)CONCAT44((float)height,(float)width);
  pVStack_38 = (pointer)0x0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (this_00,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_positions,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_coords,(long)this->m_numVertices);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_unitCoords,(long)this->m_numVertices);
  std::vector<float,_std::allocator<float>_>::resize(&this->m_attribOne,(long)this->m_numVertices);
  for (lVar12 = 0xb8; lVar12 != 0x118; lVar12 = lVar12 + 0x18) {
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               ((long)(this->m_constCoords).m_data + lVar12 + -0xc),(long)this->m_numVertices);
  }
  uVar10 = 0;
  uVar11 = 0;
  if (0 < (int)uVar7) {
    uVar11 = uVar7;
  }
  fVar21 = -0.275;
  fVar22 = 0.0;
  local_a8._16_4_ = 0.33;
  local_a8._20_4_ = -0.275;
  local_a8._24_4_ = 0.0;
  local_a8._28_4_ = 0;
  for (; uVar10 != uVar11; uVar10 = uVar10 + 1) {
    local_b8 = (float)(int)uVar10 / (float)gridSize;
    local_68 = local_b8 + local_b8 + -1.0;
    uStack_60 = 0;
    local_78 = -local_68;
    fStack_74 = -fVar21;
    fStack_6c = -fVar22;
    uStack_70 = 0x80000000;
    uStack_b0 = 0;
    local_a8._32_4_ = local_b8 * 0.25;
    fStack_84 = local_b8 * 0.5;
    fStack_80 = local_b8 * 0.0;
    fStack_7c = local_b8 * 0.0;
    fVar5 = fStack_84;
    fVar6 = fStack_7c;
    fStack_b4 = fVar21;
    fStack_ac = fVar22;
    fStack_64 = fVar21;
    fStack_5c = fVar22;
    for (uVar20 = 0; fVar22 = fVar6, fVar21 = fVar5, uVar20 != uVar7; uVar20 = uVar20 + 1) {
      local_c8.m_data[0] = (float)(int)uVar20 / (float)gridSize;
      fVar21 = local_c8.m_data[0] + local_c8.m_data[0] + -1.0;
      iVar8 = uVar10 * uVar7 + (int)uVar20;
      pVVar1 = (this->m_positions).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[iVar8].m_data[0] = fVar21;
      pVVar1[iVar8].m_data[1] = local_68;
      pVVar1[iVar8].m_data[2] = 0.0;
      pVVar1[iVar8].m_data[3] = 1.0;
      pVVar1 = (this->m_coords).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[iVar8].m_data[0] = fVar21;
      pVVar1[iVar8].m_data[1] = local_68;
      *(ulong *)(pVVar1[iVar8].m_data + 2) =
           CONCAT44(fVar21 * (float)local_a8._20_4_ + local_78,
                    local_68 * (float)local_a8._16_4_ + -fVar21);
      pVVar1 = (this->m_unitCoords).
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pVVar1[iVar8].m_data[0] = local_c8.m_data[0];
      pVVar1[iVar8].m_data[1] = local_b8;
      *(ulong *)(pVVar1[iVar8].m_data + 2) =
           CONCAT44(local_c8.m_data[0] * 0.5 + (float)local_a8._32_4_,
                    local_c8.m_data[0] * 0.33 + fStack_84);
      (this->m_attribOne).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[iVar8] = 1.0;
      local_c8.m_data[1] = local_b8;
      local_c8.m_data[2] = 0.0;
      local_c8.m_data[3] = 1.0;
      local_58 = local_c8.m_data[0];
      tcu::operator*((tcu *)local_a8,&local_c8,(Vector<float,_4> *)&local_40);
      pVVar1 = (this_00->
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
               _M_impl.super__Vector_impl_data._M_start + iVar8;
      pVVar1->m_data[0] = (float)local_a8._0_4_;
      pVVar1->m_data[1] = (float)local_a8._4_4_;
      pVVar1->m_data[2] = (float)local_a8._8_4_;
      pVVar1->m_data[3] = (float)local_a8._12_4_;
      pvVar13 = this->m_userAttribs;
      for (lVar12 = 0;
          lVar12 < (int)((ulong)((long)(this->m_userAttribTransforms).
                                       super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_userAttribTransforms).
                                      super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 6);
          lVar12 = lVar12 + 1) {
        getUserAttrib((QuadGrid *)local_a8,(int)this,local_58,local_b8);
        pVVar1 = (pvVar13->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start + iVar8;
        pVVar1->m_data[0] = (float)local_a8._0_4_;
        pVVar1->m_data[1] = (float)local_a8._4_4_;
        pVVar1->m_data[2] = (float)local_a8._8_4_;
        pVVar1->m_data[3] = (float)local_a8._12_4_;
        pvVar13 = pvVar13 + 1;
      }
      fVar5 = (float)local_a8._4_4_;
      fVar6 = (float)local_a8._12_4_;
    }
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->m_indices,(long)(this->m_numTriangles * 3));
  iVar9 = 0;
  iVar8 = 0;
  if (0 < gridSize) {
    iVar8 = gridSize;
  }
  iVar18 = gridSize + 2;
  iVar14 = 1;
  iVar15 = 0;
  while (iVar15 != iVar8) {
    iVar15 = iVar15 + 1;
    puVar2 = (this->m_indices).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar16 = iVar14;
    iVar17 = iVar18;
    for (lVar12 = 0; (ulong)(uint)gridSize * 6 - lVar12 != 0; lVar12 = lVar12 + 6) {
      iVar3 = (int)lVar12;
      uVar19 = (unsigned_short)iVar17 - 1;
      puVar2[iVar9 + iVar3] = uVar19;
      uVar4 = (unsigned_short)iVar16;
      puVar2[iVar9 + 1 + iVar3] = uVar4 - 1;
      puVar2[iVar9 + 2 + iVar3] = uVar4;
      puVar2[iVar9 + 3 + iVar3] = uVar19;
      puVar2[iVar9 + 4 + iVar3] = uVar4;
      puVar2[iVar9 + iVar3 + 5] = (unsigned_short)iVar17;
      iVar17 = iVar17 + 1;
      iVar16 = iVar16 + 1;
    }
    iVar9 = iVar9 + gridSize * 6;
    iVar18 = iVar18 + uVar7;
    iVar14 = iVar14 + uVar7;
  }
  return;
}

Assistant:

QuadGrid::QuadGrid (int										gridSize,
					int										width,
					int										height,
					const tcu::Vec4&						constCoords,
					const std::vector<tcu::Mat4>&			userAttribTransforms,
					const std::vector<TextureBindingSp>&	textures)
	: m_gridSize				(gridSize)
	, m_numVertices				((gridSize + 1) * (gridSize + 1))
	, m_numTriangles			(gridSize * gridSize * 2)
	, m_constCoords				(constCoords)
	, m_userAttribTransforms	(userAttribTransforms)
	, m_textures				(textures)
{
	const tcu::Vec4 viewportScale	((float)width, (float)height, 0.0f, 0.0f);

	// Compute vertices.
	m_screenPos.resize(m_numVertices);
	m_positions.resize(m_numVertices);
	m_coords.resize(m_numVertices);
	m_unitCoords.resize(m_numVertices);
	m_attribOne.resize(m_numVertices);

	// User attributes.
	for (int attrNdx = 0; attrNdx < DE_LENGTH_OF_ARRAY(m_userAttribs); attrNdx++)
		m_userAttribs[attrNdx].resize(m_numVertices);

	for (int y = 0; y < gridSize+1; y++)
	for (int x = 0; x < gridSize+1; x++)
	{
		float		sx			= (float)x / (float)gridSize;
		float		sy			= (float)y / (float)gridSize;
		float		fx			= 2.0f * sx - 1.0f;
		float		fy			= 2.0f * sy - 1.0f;
		int			vtxNdx		= ((y * (gridSize+1)) + x);

		m_positions[vtxNdx]		= tcu::Vec4(fx, fy, 0.0f, 1.0f);
		m_coords[vtxNdx]		= getCoords(sx, sy);
		m_unitCoords[vtxNdx]	= getUnitCoords(sx, sy);
		m_attribOne[vtxNdx]		= 1.0f;

		m_screenPos[vtxNdx]		= tcu::Vec4(sx, sy, 0.0f, 1.0f) * viewportScale;

		for (int attribNdx = 0; attribNdx < getNumUserAttribs(); attribNdx++)
			m_userAttribs[attribNdx][vtxNdx] = getUserAttrib(attribNdx, sx, sy);
	}

	// Compute indices.
	m_indices.resize(3 * m_numTriangles);
	for (int y = 0; y < gridSize; y++)
	for (int x = 0; x < gridSize; x++)
	{
		int stride				= gridSize + 1;
		int v00					= (y * stride) + x;
		int v01					= (y * stride) + x + 1;
		int v10					= ((y+1) * stride) + x;
		int v11					= ((y+1) * stride) + x + 1;

		int baseNdx				= ((y * gridSize) + x) * 6;
		m_indices[baseNdx + 0]	= (deUint16)v10;
		m_indices[baseNdx + 1]	= (deUint16)v00;
		m_indices[baseNdx + 2]	= (deUint16)v01;

		m_indices[baseNdx + 3]	= (deUint16)v10;
		m_indices[baseNdx + 4]	= (deUint16)v01;
		m_indices[baseNdx + 5]	= (deUint16)v11;
	}
}